

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O1

int undo(int f,int n)

{
  anon_enum_32 aVar1;
  uint uVar2;
  undo_rec *puVar3;
  line *plVar4;
  bool bVar5;
  anon_struct_16_2_4dd83919_for_next *paVar6;
  int iVar7;
  mgwin *pmVar8;
  int iVar9;
  mgwin *pmVar10;
  undo_rec *rec;
  mgwin *pmVar11;
  undo_rec *buf;
  int iVar12;
  int iVar13;
  bool bVar14;
  int local_3c;
  
  buf = (undo_rec *)(ulong)(uint)f;
  pmVar11 = (mgwin *)(ulong)(uint)n;
  if (n < 0) {
    iVar12 = 0;
  }
  else {
    rec = curbp->b_undoptr;
    if (((undo_nulled & rec == (undo_rec *)0x0) != 0) || (rptcount == 0)) {
      rec = (curbp->b_undo).tqh_first;
      undo_nulled = 1;
    }
    iVar12 = 1;
    if (n != 0) {
      do {
        if (rec == (undo_rec *)0x0) {
LAB_00119ea2:
          dobeep();
          rec = (undo_rec *)0x0;
          ewprintf("No further undo information");
          undo_nulled = 1;
          iVar12 = 0;
          break;
        }
        n = n + -1;
        while (rec->type == BOUNDARY) {
          puVar3 = (rec->next).tqe_next;
          paVar6 = &puVar3->next;
          if (puVar3 == (undo_rec *)0x0) {
            paVar6 = (anon_struct_16_2_4dd83919_for_next *)&curbp->b_undo;
          }
          paVar6->tqe_prev = (rec->next).tqe_prev;
          *(rec->next).tqe_prev = puVar3;
          buf = rec;
          free_undo_record(rec);
          rec = puVar3;
          if (puVar3 == (undo_rec *)0x0) goto LAB_00119ea2;
        }
        undo_nulled = 0;
        undo_add_boundary((int)buf,(int)pmVar11);
        iVar7 = boundary_flag;
        boundary_flag = 0;
        bVar5 = false;
LAB_00119d3e:
        pmVar8 = curwp;
        aVar1 = rec->type;
        if (aVar1 - BOUNDARY < 2) {
LAB_00119db6:
          switch(aVar1) {
          case INSERT:
            uVar2 = (rec->region).r_size;
            buf = (undo_rec *)(ulong)uVar2;
            pmVar11 = (mgwin *)0x0;
            ldelete(uVar2,0);
            break;
          case DELETE:
            plVar4 = curwp->w_dotp;
            iVar9 = curwp->w_doto;
            buf = (undo_rec *)rec->content;
            uVar2 = (rec->region).r_size;
            pmVar11 = (mgwin *)(ulong)uVar2;
            region_put_data((char *)buf,uVar2);
            pmVar8 = curwp;
            curwp->w_dotp = plVar4;
            pmVar8->w_doto = iVar9;
            break;
          case BOUNDARY:
            bVar5 = true;
            break;
          case MODIFIED:
            curbp->b_flag = curbp->b_flag & 0xfe;
            break;
          case DELREG:
            buf = (undo_rec *)rec->content;
            uVar2 = (rec->region).r_size;
            pmVar11 = (mgwin *)(ulong)uVar2;
            region_put_data((char *)buf,uVar2);
          }
          iVar9 = (int)buf;
          rec = (rec->next).tqe_next;
          if ((rec == (undo_rec *)0x0) || (bVar5)) goto LAB_00119e73;
          goto LAB_00119d3e;
        }
        iVar9 = rec->pos;
        pmVar11 = (mgwin *)curbp->b_headp;
        uVar2 = *(int *)((long)&pmVar11->w_bufp + 4);
        buf = (undo_rec *)(ulong)uVar2;
        pmVar10 = pmVar11;
        if ((int)uVar2 < iVar9) {
          iVar13 = 0;
          do {
            pmVar10 = (pmVar10->w_list).l_p.l_wp;
            bVar14 = pmVar10 == pmVar11;
            if (bVar14) {
              iVar9 = 0;
              pmVar10 = (mgwin *)0x0;
              iVar13 = local_3c;
              break;
            }
            iVar9 = iVar9 + ~(uint)buf;
            iVar13 = iVar13 + 1;
            uVar2 = *(int *)((long)&pmVar10->w_bufp + 4);
            buf = (undo_rec *)(ulong)uVar2;
          } while ((int)uVar2 < iVar9);
        }
        else {
          bVar14 = false;
          iVar13 = 0;
        }
        local_3c = iVar13;
        if (!bVar14) {
          curwp->w_dotp = (line *)pmVar10;
          pmVar8->w_doto = iVar9;
          pmVar8->w_markline = pmVar8->w_dotline;
          pmVar8->w_dotline = local_3c;
          pmVar11 = pmVar8;
          goto LAB_00119db6;
        }
        dobeep();
        iVar12 = 0;
        iVar9 = 0x1243a2;
        ewprintf("Internal error in Undo!");
LAB_00119e73:
        boundary_flag = iVar7;
        undo_add_boundary(iVar9,(int)pmVar11);
        buf = (undo_rec *)0x1243b4;
        ewprintf("Undo!");
      } while (n != 0);
    }
    curbp->b_undoptr = rec;
  }
  return iVar12;
}

Assistant:

int
undo(int f, int n)
{
	struct undo_rec	*ptr, *nptr;
	int		 done, rval;
	struct line	*lp;
	int		 offset, save;
	static int	 nulled = FALSE;
	int		 lineno;

	if (n < 0)
		return (FALSE);

	ptr = curbp->b_undoptr;

	/* first invocation, make ptr point back to the top of the list */
	if ((ptr == NULL && nulled == TRUE) ||  rptcount == 0) {
		ptr = TAILQ_FIRST(&curbp->b_undo);
		nulled = TRUE;
	}

	rval = TRUE;
	while (n--) {
		/* if we have a spurious boundary, free it and move on.... */
		while (ptr && ptr->type == BOUNDARY) {
			nptr = TAILQ_NEXT(ptr, next);
			TAILQ_REMOVE(&curbp->b_undo, ptr, next);
			free_undo_record(ptr);
			ptr = nptr;
		}
		/*
		 * Ptr is NULL, but on the next run, it will point to the
		 * top again, redoing all stuff done in the buffer since
		 * its creation.
		 */
		if (ptr == NULL) {
			dobeep();
			ewprintf("No further undo information");
			rval = FALSE;
			nulled = TRUE;
			break;
		}
		nulled = FALSE;

		/*
		 * Loop while we don't get a boundary specifying we've
		 * finished the current action...
		 */

		undo_add_boundary(FFRAND, 1);

		save = boundary_flag;
		boundary_flag = FALSE;

		done = 0;
		do {
			/*
			 * Move to where this has to apply
			 *
			 * Boundaries (and the modified flag)  are put as
			 * position 0 (to save lookup time in find_dot)
			 * so we must not move there...
			 */
			if (ptr->type != BOUNDARY && ptr->type != MODIFIED) {
				if (find_lo(ptr->pos, &lp,
				    &offset, &lineno) == FALSE) {
					dobeep();
					ewprintf("Internal error in Undo!");
					rval = FALSE;
					break;
				}
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				curwp->w_markline = curwp->w_dotline;
				curwp->w_dotline = lineno;
			}

			/*
			 * Do operation^-1
			 */
			switch (ptr->type) {
			case INSERT:
				ldelete(ptr->region.r_size, KNONE);
				break;
			case DELETE:
				lp = curwp->w_dotp;
				offset = curwp->w_doto;
				region_put_data(ptr->content,
				    ptr->region.r_size);
				curwp->w_dotp = lp;
				curwp->w_doto = offset;
				break;
			case DELREG:
				region_put_data(ptr->content,
				    ptr->region.r_size);
				break;
			case BOUNDARY:
				done = 1;
				break;
			case MODIFIED:
				curbp->b_flag &= ~BFCHG;
				break;
			default:
				break;
			}

			/* And move to next record */
			ptr = TAILQ_NEXT(ptr, next);
		} while (ptr != NULL && !done);

		boundary_flag = save;
		undo_add_boundary(FFRAND, 1);

		ewprintf("Undo!");
	}

	curbp->b_undoptr = ptr;

	return (rval);
}